

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool __thiscall testing::TestResult::Failed(TestResult *this)

{
  int iVar1;
  int iVar2;
  TestPartResult *pTVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  iVar1 = (int)((ulong)((long)(this->test_part_results_).
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->test_part_results_).
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249;
  bVar4 = 0 < iVar1;
  if ((0 < iVar1) && (pTVar3 = GetTestPartResult(this,0), 1 < pTVar3->type_ - kNonFatalFailure)) {
    iVar1 = 1;
    do {
      iVar2 = (int)((ulong)((long)(this->test_part_results_).
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->test_part_results_).
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      bVar6 = SBORROW4(iVar1,iVar2 * -0x49249249);
      bVar5 = iVar1 + iVar2 * 0x49249249 < 0;
      bVar4 = bVar6 != bVar5;
      if (bVar6 == bVar5) {
        return bVar4;
      }
      pTVar3 = GetTestPartResult(this,iVar1);
      iVar1 = iVar1 + 1;
    } while (1 < pTVar3->type_ - kNonFatalFailure);
  }
  return bVar4;
}

Assistant:

bool TestResult::Failed() const {
  for (int i = 0; i < total_part_count(); ++i) {
    if (GetTestPartResult(i).failed()) return true;
  }
  return false;
}